

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::torrent::tracker_request_error
          (torrent *this,tracker_request *r,error_code *ec,string *msg,seconds32 retry_interval)

{
  byte bVar1;
  uint uVar2;
  pointer paVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  session_interface *psVar5;
  pointer paVar6;
  ulong uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined3 uVar11;
  bool bVar12;
  uint8_t e;
  int iVar13;
  time_point32 now;
  announce_entry *this_00;
  long lVar14;
  undefined4 extraout_var;
  announce_endpoint *paVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  error_category *peVar16;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long lVar17;
  pointer pcVar18;
  pointer paVar19;
  long lVar20;
  endpoint *ep;
  endpoint *extraout_RDX;
  endpoint *extraout_RDX_00;
  endpoint *peVar21;
  endpoint *ep_00;
  pointer pcVar22;
  char *pcVar23;
  pointer paVar24;
  _func_int **pp_Var25;
  error_condition eVar26;
  int fails;
  endpoint local_endpoint_1;
  endpoint local_endpoint;
  error_condition local_50 [2];
  
  iVar13 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((char)iVar13 != '\0') {
    uVar2 = ec->val_;
    (*ec->cat_->_vptr_error_category[4])((string *)&local_endpoint_1,ec->cat_,(ulong)uVar2);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** tracker error: (%d) %s %s",(ulong)uVar2,
               CONCAT44(local_endpoint_1.impl_.data_.v6.sin6_flowinfo,
                        local_endpoint_1.impl_.data_._0_4_),(msg->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&local_endpoint_1);
  }
  bVar1 = r->kind;
  this_00 = find_tracker(this,&r->url);
  if ((bVar1 & 1) == 0) {
    fails = 0;
    local_endpoint.impl_.data_.v6.sin6_scope_id = 0;
    local_endpoint.impl_.data_._8_1_ = '\0';
    local_endpoint.impl_.data_._9_1_ = '\0';
    local_endpoint.impl_.data_._10_1_ = '\0';
    local_endpoint.impl_.data_._11_1_ = '\0';
    local_endpoint.impl_.data_._12_1_ = '\0';
    local_endpoint.impl_.data_._13_1_ = '\0';
    local_endpoint.impl_.data_._14_1_ = '\0';
    local_endpoint.impl_.data_._15_1_ = '\0';
    local_endpoint.impl_.data_._16_8_ = 0;
    local_endpoint.impl_.data_._0_8_ = 2;
    if (this_00 != (announce_entry *)0x0) {
      paVar24 = (this_00->endpoints).
                super__Vector_base<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar3 = (this_00->endpoints).
               super__Vector_base<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar17 = (long)paVar3 - (long)paVar24;
      lVar20 = lVar17 % 0x78;
      p_Var4 = (r->outgoing_socket).m_sock.
               super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      paVar24 = paVar24 + 2;
      for (lVar14 = lVar17 / 0x78 >> 2; 0 < lVar14; lVar14 = lVar14 + -1) {
        if (p_Var4 == paVar24[-2].socket.m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi) {
          paVar19 = paVar24 + -2;
          goto LAB_00289e59;
        }
        if (p_Var4 == paVar24[-1].socket.m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi) {
          paVar19 = paVar24 + -1;
          goto LAB_00289e59;
        }
        paVar19 = paVar24;
        if (p_Var4 == (paVar24->socket).m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi) goto LAB_00289e59;
        if (p_Var4 == paVar24[1].socket.m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi) {
          paVar19 = paVar24 + 1;
          goto LAB_00289e59;
        }
        paVar24 = paVar24 + 4;
        lVar17 = lVar17 + -0x1e0;
      }
      lVar14 = lVar17 / 0x78;
      lVar20 = lVar17 % 0x78;
      paVar19 = paVar24 + -2;
      if (lVar14 == 3) {
        if (p_Var4 != paVar24[-2].socket.m_sock.
                      super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi) {
          paVar19 = paVar24 + -1;
          goto LAB_0028a1ee;
        }
LAB_00289e59:
        if (paVar19 == paVar3) goto LAB_00289f8b;
        local_endpoint.impl_.data_._0_8_ = *(undefined8 *)&(paVar19->local_endpoint).impl_.data_;
        local_endpoint.impl_.data_.v4.sin_zero =
             *(uchar (*) [8])((long)&(paVar19->local_endpoint).impl_.data_ + 8);
        local_endpoint.impl_.data_._16_8_ =
             *(undefined8 *)((long)&(paVar19->local_endpoint).impl_.data_ + 0x10);
        local_endpoint.impl_.data_.v6.sin6_scope_id =
             (paVar19->local_endpoint).impl_.data_.v6.sin6_scope_id;
        psVar5 = (this->super_torrent_hot_members).m_ses;
        iVar13 = (*(psVar5->super_session_logger)._vptr_session_logger[0x2d])(psVar5,paVar3,lVar20);
        iVar13 = aux::session_settings::get_int
                           ((session_settings *)CONCAT44(extraout_var_01,iVar13),0x406c);
        announce_endpoint::failed(paVar19,iVar13,retry_interval);
        bVar12 = ec->failed_;
        uVar11 = *(undefined3 *)&ec->field_0x5;
        peVar16 = ec->cat_;
        (paVar19->last_error).val_ = ec->val_;
        (paVar19->last_error).failed_ = bVar12;
        *(undefined3 *)&(paVar19->last_error).field_0x5 = uVar11;
        (paVar19->last_error).cat_ = peVar16;
        std::__cxx11::string::_M_assign((string *)paVar19);
        fails = *(ushort *)&paVar19->field_0x74 & 0x7f;
        print_endpoint_abi_cxx11_
                  ((string *)&local_endpoint_1,(libtorrent *)&paVar19->local_endpoint,ep);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"*** increment tracker fail count [ep: %s url: %s %d]",
                   CONCAT44(local_endpoint_1.impl_.data_.v6.sin6_flowinfo,
                            local_endpoint_1.impl_.data_._0_4_),(r->url)._M_dataplus._M_p,
                   (ulong)(*(ushort *)&paVar19->field_0x74 & 0x7f));
        std::__cxx11::string::~string((string *)&local_endpoint_1);
        eVar26 = boost::system::errc::make_error_condition(address_family_not_supported);
        local_endpoint_1.impl_.data_._0_4_ = eVar26.val_;
        local_endpoint_1.impl_.data_.v6.sin6_flowinfo = eVar26._4_4_;
        local_endpoint_1.impl_.data_._8_4_ = eVar26.cat_._0_4_;
        local_endpoint_1.impl_.data_._12_4_ = eVar26.cat_._4_4_;
        bVar12 = boost::system::operator==(ec,(error_condition *)&local_endpoint_1);
        peVar21 = extraout_RDX;
        if (bVar12) {
LAB_00289f5d:
          paVar19->field_0x75 = paVar19->field_0x75 & 0xf7;
          print_endpoint_abi_cxx11_
                    ((string *)&local_endpoint_1,(libtorrent *)&paVar19->local_endpoint,peVar21);
          pcVar22 = (pointer)CONCAT44(local_endpoint_1.impl_.data_.v6.sin6_flowinfo,
                                      local_endpoint_1.impl_.data_._0_4_);
          pcVar18 = (r->url)._M_dataplus._M_p;
          pp_Var25 = (this->super_request_callback)._vptr_request_callback;
          pcVar23 = "*** disabling endpoint [ep: %s url: %s ]";
          goto LAB_00289fd9;
        }
        local_50[0] = boost::system::errc::make_error_condition(host_unreachable);
        bVar12 = boost::system::operator==(ec,local_50);
        peVar21 = extraout_RDX_00;
        if (bVar12) goto LAB_00289f5d;
      }
      else {
        if (lVar14 == 2) {
LAB_0028a1ee:
          if (p_Var4 != (paVar19->socket).m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) {
            paVar19 = paVar19 + 1;
            goto LAB_0028a1fd;
          }
          goto LAB_00289e59;
        }
        if (lVar14 == 1) {
LAB_0028a1fd:
          if (p_Var4 != (paVar19->socket).m_sock.
                        super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi) {
            paVar19 = paVar3;
          }
          goto LAB_00289e59;
        }
LAB_00289f8b:
        if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (p_Var4->_M_use_count != 0)) {
          pcVar22 = (r->url)._M_dataplus._M_p;
          aux::listen_socket_handle::get_local_endpoint((endpoint *)local_50,&r->outgoing_socket);
          print_endpoint_abi_cxx11_((string *)&local_endpoint_1,(libtorrent *)local_50,ep_00);
          pcVar18 = (pointer)CONCAT44(local_endpoint_1.impl_.data_.v6.sin6_flowinfo,
                                      local_endpoint_1.impl_.data_._0_4_);
          pp_Var25 = (this->super_request_callback)._vptr_request_callback;
          pcVar23 = "*** no matching endpoint for request [%s, %s]";
LAB_00289fd9:
          (*pp_Var25[7])(this,pcVar23,pcVar22,pcVar18);
          std::__cxx11::string::~string((string *)&local_endpoint_1);
        }
      }
      paVar6 = (this->m_trackers).
               super_vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>
               .
               super__Vector_base<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      peVar16 = http_category();
      local_endpoint_1.impl_.data_._0_4_ = 0x19a;
      bVar12 = boost::system::detail::failed_impl(0x19a,peVar16);
      local_endpoint_1.impl_.data_.base.sa_data[2] = bVar12;
      local_endpoint_1.impl_.data_._8_4_ = SUB84(peVar16,0);
      local_endpoint_1.impl_.data_._12_4_ = (undefined4)((ulong)peVar16 >> 0x20);
      bVar12 = boost::system::operator==(ec,(error_code *)&local_endpoint_1);
      if (bVar12) {
        this_00->fail_limit = '\x01';
      }
      paVar24 = (this_00->endpoints).
                super__Vector_base<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar3 = (this_00->endpoints).
               super__Vector_base<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar17 = (long)paVar3 - (long)paVar24;
      paVar24 = paVar24 + 2;
      for (lVar14 = lVar17 / 0x78 >> 2; 0 < lVar14; lVar14 = lVar14 + -1) {
        if ((paVar24[-2].field_0x74 & 0x7f) == 0) {
          paVar19 = paVar24 + -2;
          goto LAB_0028a0da;
        }
        if ((paVar24[-1].field_0x74 & 0x7f) == 0) {
          paVar19 = paVar24 + -1;
          goto LAB_0028a0da;
        }
        paVar19 = paVar24;
        if ((paVar24->field_0x74 & 0x7f) == 0) goto LAB_0028a0da;
        if ((paVar24[1].field_0x74 & 0x7f) == 0) {
          paVar19 = paVar24 + 1;
          goto LAB_0028a0da;
        }
        paVar24 = paVar24 + 4;
        lVar17 = lVar17 + -0x1e0;
      }
      lVar17 = lVar17 / 0x78;
      paVar19 = paVar24 + -2;
      if (lVar17 == 1) {
LAB_0028a1cd:
        if ((paVar19->field_0x74 & 0x7f) != 0) {
          paVar19 = paVar3;
        }
LAB_0028a0da:
        if (paVar19 != paVar3) goto LAB_0028a0ec;
      }
      else {
        if (lVar17 == 3) {
          if ((paVar24[-2].field_0x74 & 0x7f) != 0) {
            paVar19 = paVar24 + -1;
            goto LAB_0028a1bf;
          }
          goto LAB_0028a0da;
        }
        if (lVar17 == 2) {
LAB_0028a1bf:
          if ((paVar19->field_0x74 & 0x7f) != 0) {
            paVar19 = paVar19 + 1;
            goto LAB_0028a1cd;
          }
          goto LAB_0028a0da;
        }
      }
      deprioritize_tracker(this,(int)(((long)this_00 - (long)paVar6) / 0x60));
    }
LAB_0028a0ec:
    iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    if (((*(uint *)(CONCAT44(extraout_var_02,iVar13) + 0x68) & 0x11) != 0) ||
       (r->triggered_manually == true)) {
      iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      get_handle((torrent *)&local_endpoint_1);
      alert_manager::
      emplace_alert<libtorrent::tracker_error_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int&,std::__cxx11::string_const&,boost::system::error_code_const&,std::__cxx11::string_const&>
                ((alert_manager *)CONCAT44(extraout_var_03,iVar13),
                 (torrent_handle *)&local_endpoint_1,&local_endpoint,&fails,&r->url,ec,msg);
      peVar21 = &local_endpoint_1;
LAB_0028a14d:
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&(peVar21->impl_).data_.v6.sin6_addr);
    }
  }
  else {
    peVar16 = http_category();
    local_endpoint_1.impl_.data_._0_4_ = 0x19a;
    bVar12 = boost::system::detail::failed_impl(0x19a,peVar16);
    local_endpoint_1.impl_.data_.base.sa_data[2] = bVar12;
    local_endpoint_1.impl_.data_._8_4_ = SUB84(peVar16,0);
    local_endpoint_1.impl_.data_._12_4_ = (undefined4)((ulong)peVar16 >> 0x20);
    bVar12 = boost::system::operator==(ec,(error_code *)&local_endpoint_1);
    if ((this_00 != (announce_entry *)0x0) && (bVar12)) {
      this_00->fail_limit = '\x01';
    }
    iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    if (((*(uint *)(CONCAT44(extraout_var,iVar13) + 0x68) & 0x11) != 0) ||
       (r->triggered_manually == true)) {
      local_endpoint_1.impl_.data_.v6.sin6_scope_id = 0;
      local_endpoint_1.impl_.data_._8_4_ = 0;
      local_endpoint_1.impl_.data_._12_4_ = 0;
      local_endpoint_1.impl_.data_._16_4_ = 0;
      local_endpoint_1.impl_.data_._20_4_ = 0;
      local_endpoint_1.impl_.data_._0_4_ = 2;
      local_endpoint_1.impl_.data_.v6.sin6_flowinfo = 0;
      if ((this_00 != (announce_entry *)0x0) &&
         (paVar15 = announce_entry::find_endpoint(this_00,&r->outgoing_socket),
         paVar15 != (announce_endpoint *)0x0)) {
        uVar8 = *(undefined8 *)&(paVar15->local_endpoint).impl_.data_;
        uVar9 = *(undefined8 *)((long)&(paVar15->local_endpoint).impl_.data_ + 8);
        uVar10 = *(undefined8 *)((long)&(paVar15->local_endpoint).impl_.data_ + 0x14);
        local_endpoint_1.impl_.data_._16_4_ =
             (undefined4)
             ((ulong)*(undefined8 *)((long)&(paVar15->local_endpoint).impl_.data_ + 0xc) >> 0x20);
        local_endpoint_1.impl_.data_._20_4_ = (undefined4)uVar10;
        local_endpoint_1.impl_.data_.v6.sin6_scope_id = (uint32_t)((ulong)uVar10 >> 0x20);
        local_endpoint_1.impl_.data_._0_4_ = (undefined4)uVar8;
        local_endpoint_1.impl_.data_.v6.sin6_flowinfo = (uint32_t)((ulong)uVar8 >> 0x20);
        local_endpoint_1.impl_.data_._8_4_ = (undefined4)uVar9;
        local_endpoint_1.impl_.data_._12_4_ = (undefined4)((ulong)uVar9 >> 0x20);
      }
      iVar13 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      get_handle((torrent *)&local_endpoint);
      alert_manager::
      emplace_alert<libtorrent::scrape_failed_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,std::__cxx11::string_const&,boost::system::error_code_const&>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar13),(torrent_handle *)&local_endpoint
                 ,&local_endpoint_1,&r->url,ec);
      peVar21 = &local_endpoint;
      goto LAB_0028a14d;
    }
  }
  uVar7 = *(ulong *)&(this->super_torrent_hot_members).field_0x38;
  if (((uint)uVar7 >> 0x1a & 1) == 0) {
    e = r->event;
    if (e != '\x03' && (uVar7 & 0x18000000) != 0) goto LAB_0028a18d;
  }
  else {
    e = '\x03';
    if (r->event != '\x03') goto LAB_0028a18d;
  }
  announce_with_tracker(this,e);
LAB_0028a18d:
  now = aux::time_now32();
  update_tracker_timer(this,now);
  return;
}

Assistant:

void torrent::tracker_request_error(tracker_request const& r
		, error_code const& ec, std::string const& msg
		, seconds32 const retry_interval)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("*** tracker error: (%d) %s %s", ec.value()
				, ec.message().c_str(), msg.c_str());
		}
#endif
		if (0 == (r.kind & tracker_request::scrape_request))
		{
			// announce request
			announce_entry* ae = find_tracker(r.url);
			int fails = 0;
			tcp::endpoint local_endpoint;
			if (ae)
			{
				auto aep = std::find_if(ae->endpoints.begin(), ae->endpoints.end()
					, [&](announce_endpoint const& e) { return e.socket == r.outgoing_socket; });

				if (aep != ae->endpoints.end())
				{
					local_endpoint = aep->local_endpoint;
					aep->failed(settings().get_int(settings_pack::tracker_backoff)
						, retry_interval);
					aep->last_error = ec;
					aep->message = msg;
					fails = aep->fails;
#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** increment tracker fail count [ep: %s url: %s %d]"
						, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str(), aep->fails);
#endif
					// don't try to announce from this endpoint again
					if (ec == boost::system::errc::address_family_not_supported
						|| ec == boost::system::errc::host_unreachable)
					{
						aep->enabled = false;
#ifndef TORRENT_DISABLE_LOGGING
						debug_log("*** disabling endpoint [ep: %s url: %s ]"
							, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str());
#endif
					}
				}
				else if (r.outgoing_socket)
				{
#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** no matching endpoint for request [%s, %s]"
						, r.url.c_str(), print_endpoint(r.outgoing_socket.get_local_endpoint()).c_str());
#endif
				}

				int const tracker_index = int(ae - m_trackers.data());

				// never talk to this tracker again
				if (ec == error_code(410, http_category())) ae->fail_limit = 1;

				// if all endpoints fail, then we de-prioritize the tracker and try
				// the next one in the tier
				if (std::all_of(ae->endpoints.begin(), ae->endpoints.end()
					, [](announce_endpoint const& ep) { return ep.fails > 0; }))
				{
					deprioritize_tracker(tracker_index);
				}
			}
			if (m_ses.alerts().should_post<tracker_error_alert>()
				|| r.triggered_manually)
			{
				m_ses.alerts().emplace_alert<tracker_error_alert>(get_handle()
					, local_endpoint, fails, r.url, ec, msg);
			}
		}
		else
		{
			announce_entry* ae = find_tracker(r.url);

			// scrape request
			if (ec == error_code(410, http_category()))
			{
				// never talk to this tracker again
				if (ae != nullptr) ae->fail_limit = 1;
			}

			// if this was triggered manually we need to post this unconditionally,
			// since the client expects a response from its action, regardless of
			// whether all tracker events have been enabled by the alert mask
			if (m_ses.alerts().should_post<scrape_failed_alert>()
				|| r.triggered_manually)
			{
				tcp::endpoint local_endpoint;
				if (ae != nullptr)
				{
					auto aep = ae->find_endpoint(r.outgoing_socket);
					if (aep != nullptr) local_endpoint = aep->local_endpoint;
				}

				m_ses.alerts().emplace_alert<scrape_failed_alert>(get_handle(), local_endpoint, r.url, ec);
			}
		}
		// announce to the next working tracker
		if ((!m_abort && !is_paused()) || r.event == tracker_request::stopped)
			announce_with_tracker(r.event);
		update_tracker_timer(aux::time_now32());
	}